

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_presets.c
# Opt level: O0

lzma_bool lzma_lzma_preset(lzma_options_lzma *options,uint32_t preset)

{
  uint uVar1;
  lzma_match_finder lVar2;
  uint32_t uVar3;
  uint32_t local_2c;
  uint32_t supported_flags;
  uint32_t flags;
  uint32_t level;
  uint32_t preset_local;
  lzma_options_lzma *options_local;
  
  uVar1 = preset & 0x1f;
  if ((uVar1 < 10) && ((preset & 0x7fffffe0) == 0)) {
    options->preset_dict = (uint8_t *)0x0;
    options->preset_dict_size = 0;
    options->lc = 3;
    options->lp = 0;
    options->pb = 2;
    options->dict_size = 1 << ("\x12\x14\x15\x16\x16\x17\x17\x18\x19\x1a"[uVar1] & 0x1f);
    if (uVar1 < 4) {
      options->mode = LZMA_MODE_FAST;
      lVar2 = LZMA_MF_HC4;
      if (uVar1 == 0) {
        lVar2 = LZMA_MF_HC3;
      }
      options->mf = lVar2;
      uVar3 = 0x111;
      if (uVar1 < 2) {
        uVar3 = 0x80;
      }
      options->nice_len = uVar3;
      options->depth = (uint)"\x04\b\x180"[uVar1];
    }
    else {
      options->mode = LZMA_MODE_NORMAL;
      options->mf = LZMA_MF_BT4;
      if (uVar1 == 4) {
        local_2c = 0x10;
      }
      else {
        local_2c = 0x40;
        if (uVar1 == 5) {
          local_2c = 0x20;
        }
      }
      options->nice_len = local_2c;
      options->depth = 0;
    }
    if ((preset & 0x80000000) != 0) {
      options->mode = LZMA_MODE_NORMAL;
      options->mf = LZMA_MF_BT4;
      if ((uVar1 == 3) || (uVar1 == 5)) {
        options->nice_len = 0xc0;
        options->depth = 0;
      }
      else {
        options->nice_len = 0x111;
        options->depth = 0x200;
      }
    }
    options_local._7_1_ = '\0';
  }
  else {
    options_local._7_1_ = '\x01';
  }
  return options_local._7_1_;
}

Assistant:

extern LZMA_API(lzma_bool)
lzma_lzma_preset(lzma_options_lzma *options, uint32_t preset)
{
	static const uint8_t dict_size_values[] = { 18, 20, 21, 22, 22, 23, 23, 24, 25, 26 };
	static const uint8_t depth_values[] = { 4, 8, 24, 48 };

	const uint32_t level = preset & LZMA_PRESET_LEVEL_MASK;
	const uint32_t flags = preset & ~LZMA_PRESET_LEVEL_MASK;
	const uint32_t supported_flags = LZMA_PRESET_EXTREME;

	if (level > 9 || (flags & ~supported_flags))
		return true;

	options->preset_dict = NULL;
	options->preset_dict_size = 0;

	options->lc = LZMA_LC_DEFAULT;
	options->lp = LZMA_LP_DEFAULT;
	options->pb = LZMA_PB_DEFAULT;

	options->dict_size = UINT32_C(1) << dict_size_values[level];

	if (level <= 3) {
		options->mode = LZMA_MODE_FAST;
		options->mf = level == 0 ? LZMA_MF_HC3 : LZMA_MF_HC4;
		options->nice_len = level <= 1 ? 128 : 273;
		options->depth = depth_values[level];
	} else {
		options->mode = LZMA_MODE_NORMAL;
		options->mf = LZMA_MF_BT4;
		options->nice_len = level == 4 ? 16 : level == 5 ? 32 : 64;
		options->depth = 0;
	}

	if (flags & LZMA_PRESET_EXTREME) {
		options->mode = LZMA_MODE_NORMAL;
		options->mf = LZMA_MF_BT4;
		if (level == 3 || level == 5) {
			options->nice_len = 192;
			options->depth = 0;
		} else {
			options->nice_len = 273;
			options->depth = 512;
		}
	}

	return false;
}